

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O3

int __thiscall
wigwag::detail::
signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::connect(signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  ulong uVar2;
  runtime_error *this_00;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  long *plVar3;
  uint in_R8D;
  undefined1 local_54 [4];
  sockaddr *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  long *local_38;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  uVar2 = (**(code **)(*plVar3 + 0x30))(plVar3);
  if ((uVar2 & 1) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"The signal restrains connecting asynchronous handlers!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(plVar3 + 0xe));
  if (iVar1 == 0) {
    local_40 = local_54;
    local_50 = __addr;
    local_48 = CONCAT44(in_register_0000000c,__len);
    local_38 = plVar3;
    listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
    ::
    create_node<wigwag::detail::signal_impl<void(),wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::connect(std::shared_ptr<wigwag::task_executor>,std::function<void()>,wigwag::handler_attributes)::_lambda(wigwag::life_assurance::intrusive_life_tokens::life_checker)_1_>
              ((listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
                *)this,__fd + 8,(anon_class_32_4_c49eac36 *)(ulong)in_R8D);
    pthread_mutex_unlock((pthread_mutex_t *)(plVar3 + 0xe));
    return (int)this;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

virtual token connect(std::shared_ptr<task_executor> worker, handler_type handler, handler_attributes attributes)
        {
            if (contains_flag(this->get_attributes(), signal_attributes::connect_sync_only))
                WIGWAG_THROW("The signal restrains connecting asynchronous handlers!");

            this->get_lock_primitive().lock_nonrecursive();
            auto sg = detail::at_scope_exit([&] { this->get_lock_primitive().unlock_nonrecursive(); } );

            return this->create_node(attributes,
                    [&](life_checker lc) {
                        async_handler<Signature_, LifeAssurancePolicy_> real_handler(std::move(worker), std::move(lc), std::move(handler));
                        if (!contains_flag(attributes, handler_attributes::suppress_populator) && this->get_handler_processor().has_populate_state())
                            this->get_exception_handler().handle_exceptions([&] { this->get_handler_processor().populate_state(real_handler); });
                        return real_handler;
                    });
        }